

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall compiler::CompilerAstWalker::loadVariable(CompilerAstWalker *this,string *str)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  reference __lhs;
  size_type arg;
  size_t closureIndex;
  ClosureContext cc_1;
  size_t index_1;
  string local_80;
  undefined1 local_60 [8];
  shared_ptr<compiler::EmissionContext> ec;
  size_t localOffsets;
  ClosureContext *cc;
  iterator __end3;
  iterator __begin3;
  vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_> *__range3;
  size_t i;
  size_t index;
  string *str_local;
  CompilerAstWalker *this_local;
  
  index = (size_t)str;
  str_local = (string *)this;
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  bVar1 = EmissionContext::GetDeclarationIndex(peVar3,(string *)index,&i,false);
  if (bVar1) {
    emit(this,LoadLocal,i);
  }
  else {
    __range3 = (vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_> *)0x0;
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    __end3 = std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::begin
                       (&peVar3->closures);
    cc = (ClosureContext *)
         std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::end
                   (&peVar3->closures);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
                                       *)&cc), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
              ::operator*(&__end3);
      _Var2 = std::operator==(&__lhs->value,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              index);
      if (_Var2) {
        emit(this,LoadClosure,(size_t)__range3);
        return;
      }
      __range3 = (vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_> *)
                 ((long)&(__range3->
                         super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      __gnu_cxx::
      __normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
      ::operator++(&__end3);
    }
    ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    std::shared_ptr<compiler::EmissionContext>::shared_ptr
              ((shared_ptr<compiler::EmissionContext> *)local_60,&peVar3->outerContext);
    while( true ) {
      bVar1 = std::operator!=((shared_ptr<compiler::EmissionContext> *)local_60,(nullptr_t)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 "Emission context was nullptr when we expected one in resolving closure",
                 (allocator<char> *)((long)&index_1 + 7));
      Error::assertWithPanic(bVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&index_1 + 7));
      peVar3 = std::
               __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      bVar1 = EmissionContext::GetDeclarationIndex
                        (peVar3,(string *)index,&cc_1.localScopeIndex,true);
      if (bVar1) break;
      peVar3 = std::
               __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      std::shared_ptr<compiler::EmissionContext>::operator=
                ((shared_ptr<compiler::EmissionContext> *)local_60,&peVar3->outerContext);
      ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
    }
    ClosureContext::ClosureContext((ClosureContext *)&closureIndex);
    std::__cxx11::string::operator=((string *)&closureIndex,(string *)index);
    cc_1.value.field_2._8_8_ =
         ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    cc_1.outerScopeCount = cc_1.localScopeIndex;
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    arg = std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::size
                    (&peVar3->closures);
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::push_back
              (&peVar3->closures,(value_type *)&closureIndex);
    emit(this,LoadClosure,arg);
    ClosureContext::~ClosureContext((ClosureContext *)&closureIndex);
    std::shared_ptr<compiler::EmissionContext>::~shared_ptr
              ((shared_ptr<compiler::EmissionContext> *)local_60);
  }
  return;
}

Assistant:

void loadVariable(const std::string& str) noexcept {
    std::size_t index;
    if (this->ec->GetDeclarationIndex(str, index, false)) {
      // it's a local
      this->emit(bytecode::ByteCodeInstruction::LoadLocal, index);
    } else {
      // it's a closure
      std::size_t i = 0;
      for (const auto& cc : this->ec->closures) {
        if (cc.value == str) {
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, i);
          return;
        }
        i++;
      }
      // if we've gotten to this point, we need to add a new closure
      std::size_t localOffsets = 1;
      auto ec = this->ec->outerContext;

      while (true) {
        Error::assertWithPanic(ec != nullptr, "Emission context was nullptr when we expected one in resolving closure");
        std::size_t index;
        if (ec->GetDeclarationIndex(str, index, true)) {
          ClosureContext cc;
          cc.value = str;
          cc.outerScopeCount = localOffsets;
          cc.localScopeIndex = index;
          std::size_t closureIndex = this->ec->closures.size();
          this->ec->closures.push_back(cc);
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, closureIndex);
          return;
        }
        ec = ec->outerContext;
        localOffsets++;
      }
    }
  }